

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O1

void __thiscall
mxx::custom_op<long>::custom_op<MxxReduce_GlobalReduce_Test::TestBody()::__0>(custom_op<long> *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 *puVar5;
  _func_void__Any_data_ptr_void_ptr_ptr_void_ptr_ptr_int_ptr_ptr_ompi_datatype_t_ptr_ptr_ptr
  *__tmp_2;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  datatype dt;
  _Any_data __tmp;
  undefined1 local_48 [16];
  undefined8 local_38;
  _Invoker_type p_Stack_30;
  int local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  this->_vptr_custom_op = (_func_int **)&PTR__custom_op_00181620;
  *(undefined8 *)&(this->m_user_func).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_user_func).super__Function_base._M_functor + 8) = 0;
  (this->m_user_func).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_user_func)._M_invoker = (_Invoker_type)0x0;
  this->m_builtin = false;
  local_38._0_1_ = false;
  local_38._1_7_ = 0;
  p_Stack_30 = (_Invoker_type)0x0;
  local_48._0_8_ = (_func_int **)0x0;
  local_48._8_8_ = (MPI_Datatype)0x0;
  puVar5 = (undefined8 *)operator_new(0x10);
  *puVar5 = custom_function<MxxReduce_GlobalReduce_Test::TestBody()::__0>;
  local_48._0_4_ = SUB84(puVar5,0);
  uVar1 = local_48._0_4_;
  local_48._4_4_ = (undefined4)((ulong)puVar5 >> 0x20);
  uVar2 = local_48._4_4_;
  uVar3 = local_48._8_4_;
  uVar4 = local_48._12_4_;
  local_28 = local_48._0_4_;
  uStack_24 = local_48._4_4_;
  uStack_20 = local_48._8_4_;
  uStack_1c = local_48._12_4_;
  local_48._0_8_ = (_func_int **)0x0;
  local_48._8_8_ = (MPI_Datatype)0x0;
  *(undefined4 *)&(this->m_user_func).super__Function_base._M_functor = uVar1;
  *(undefined4 *)((long)&(this->m_user_func).super__Function_base._M_functor + 4) = uVar2;
  *(undefined4 *)((long)&(this->m_user_func).super__Function_base._M_functor + 8) = uVar3;
  *(undefined4 *)((long)&(this->m_user_func).super__Function_base._M_functor + 0xc) = uVar4;
  local_38 = (this->m_user_func).super__Function_base._M_manager;
  (this->m_user_func).super__Function_base._M_manager =
       std::
       _Function_handler<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**),_std::_Bind<void_(*((lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp:242:47),_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))((lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp:242:47),_void_*,_void_*,_int_*,_ompi_datatype_t_**)>_>
       ::_M_manager;
  p_Stack_30 = (this->m_user_func)._M_invoker;
  (this->m_user_func)._M_invoker =
       std::
       _Function_handler<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**),_std::_Bind<void_(*((lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp:242:47),_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))((lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp:242:47),_void_*,_void_*,_int_*,_ompi_datatype_t_**)>_>
       ::_M_invoke;
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)((_Any_data *)local_48,(_Any_data *)local_48,__destroy_functor);
  }
  local_48._0_8_ = &PTR__datatype_00180c80;
  local_48._8_8_ = &ompi_mpi_long;
  local_38._0_1_ = true;
  MPI_Type_dup(&ompi_mpi_long,&this->m_type_copy);
  local_28 = 0x543;
  attr_map<int,_std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>_>::set
            (&this->m_type_copy,&local_28,&this->m_user_func);
  MPI_Op_create(mpi_user_function,1,&this->m_op);
  datatype::~datatype((datatype *)local_48);
  return;
}

Assistant:

custom_op(Func func, const bool commutative = true) : m_builtin(false) {
        if (mxx::is_builtin_type<T>::value) {
            // check if the operator is MPI built-in (in case the type
            // is also a MPI built-in type)
            MPI_Op op = get_builtin_op<T, Func>::op(std::forward<Func>(func));
            if (op != MPI_OP_NULL) {
                // this op is builtin, save it as such and don't copy built-in type
                m_builtin = true;
                m_op = op;
                mxx::datatype dt = mxx::get_datatype<T>();
                m_type_copy = dt.type();
            }
        }
        if (!m_builtin) {
            // create user function
            namespace ph = std::placeholders;
            m_user_func = std::bind(custom_op::custom_function<Func>,
                                   std::forward<Func>(func),
                                   ph::_1, ph::_2, ph::_3, ph::_4);
            // get datatype associated with the type `T`
            mxx::datatype dt = mxx::get_datatype<T>();
            // attach function to a copy of the datatype
            MPI_Type_dup(dt.type(), &m_type_copy);
            attr_map<int, func_t>::set(m_type_copy, 1347, m_user_func);
            // create op
            MPI_Op_create(&custom_op::mpi_user_function, commutative, &m_op);
        }
    }